

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void __thiscall Bitmap::duplicateLineDown(Bitmap *this,uint32_t y,uint32_t times)

{
  uint32_t uVar1;
  bool value;
  uint32_t i_1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  uint32_t x;
  uint32_t x_00;
  ulong uVar5;
  uint32_t i;
  uint uVar6;
  int iVar7;
  
  if (this->orientation == Horizontally) {
    uVar6 = this->widthByte;
    iVar7 = y * uVar6;
    for (uVar3 = 1;
        (uVar3 <= times && (iVar4 = uVar6 * uVar3, iVar7 + uVar6 + iVar4 <= this->lengthByte));
        uVar3 = uVar3 + 1) {
      for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
        this->data[(uint)(iVar4 + iVar7 + (int)uVar5)] = this->data[(uint)(iVar7 + (int)uVar5)];
        uVar6 = this->widthByte;
      }
    }
  }
  else {
    uVar1 = this->height;
    for (x_00 = 0; x_00 != uVar1; x_00 = x_00 + 1) {
      iVar2 = getPixelIndex(this,x_00,y);
      value = getPixelValue(this,iVar2);
      for (uVar6 = 1; uVar6 <= times; uVar6 = uVar6 + 1) {
        iVar2 = getPixelIndex(this,x_00,y + uVar6);
        setPixelValue(this,iVar2,value);
      }
    }
  }
  return;
}

Assistant:

void Bitmap::duplicateLineDown(const uint32_t y, const uint32_t times)
{
#if 1
   if (orientation == Orientation::Horizontally)
   {
      //for horizontal orientation, this operation can be done very efficient just coping bytes
      uint32_t origin = y * this->widthByte;
      for (uint32_t i = 1; i <= times; ++i)
      {
         uint32_t line = i*this->widthByte + origin;
         if (line + this->widthByte <= this->lengthByte) //preven buffer overflow
         {
            for (uint32_t j = 0; j < this->widthByte; ++j)
            {
               this->data[line + j] = this->data[origin + j];
            }
            continue;
         }
         break;
      }
   }
   else //Vertically
#endif
   {
      //for vertical orientation, this must be done plain... (pixel by pixel)
      uint32_t xend = (orientation == Orientation::Horizontally) ? this->width : this->height; //but can also be done for horizontal orientation
      for (uint32_t x = 0; x < xend; ++x)
      {
         uint32_t sourcePixel = getPixelIndex(x, y);
         bool value = getPixelValue(sourcePixel);
         for (uint32_t i = 1; i <= times; ++i)
         {
            uint32_t destinationPixel = getPixelIndex(x, y+i);
            setPixelValue(destinationPixel, value);
         }
      }
   }
}